

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

bool __thiscall wallet::SQLiteBatch::ReadKey(SQLiteBatch *this,DataStream *key,DataStream *value)

{
  long lVar1;
  wallet *this_00;
  size_type sVar2;
  string_view source_file;
  bool bVar3;
  int iVar4;
  Logger *pLVar5;
  string *args_1;
  string *in_R9;
  pointer pbVar6;
  pointer pbVar7;
  long in_FS_OFFSET;
  string_view str;
  Span<const_std::byte> SVar8;
  string_view logging_function;
  char local_e8 [14] [8];
  string local_78;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_database->m_db != (sqlite3 *)0x0) {
    this_00 = (wallet *)this->m_read_stmt;
    if (this_00 == (wallet *)0x0) {
      __assert_fail("m_read_stmt",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
                    ,0x1cc,"virtual bool wallet::SQLiteBatch::ReadKey(DataStream &&, DataStream &)")
      ;
    }
    pbVar7 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_start;
    pbVar6 = (key->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
             .super__Vector_impl_data._M_finish;
    sVar2 = key->m_read_pos;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&log_msg,"key",(allocator<char> *)&local_78);
    pbVar7 = pbVar7 + sVar2;
    pbVar6 = pbVar6 + -(long)pbVar7;
    args_1 = &log_msg;
    SVar8.m_size = (size_t)args_1;
    SVar8.m_data = pbVar6;
    bVar3 = BindBlobToStatement(this_00,(sqlite3_stmt *)&DAT_00000001,(int)pbVar7,SVar8,in_R9);
    std::__cxx11::string::~string((string *)&log_msg);
    if (bVar3) {
      iVar4 = sqlite3_step(this->m_read_stmt);
      if (iVar4 == 100) {
        pbVar7 = (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
            _M_impl.super__Vector_impl_data._M_finish != pbVar7) {
          (value->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
          super__Vector_impl_data._M_finish = pbVar7;
        }
        value->m_read_pos = 0;
        SVar8 = SpanFromBlob(this->m_read_stmt,0);
        DataStream::write(value,(int)SVar8.m_data,(void *)SVar8.m_size,(size_t)pbVar6);
        bVar3 = true;
      }
      else {
        if (iVar4 != 0x65) {
          local_e8[0] = (char  [8])sqlite3_errstr(iVar4);
          pLVar5 = LogInstance();
          bVar3 = BCLog::Logger::Enabled(pLVar5);
          if (bVar3) {
            log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
            log_msg._M_string_length = 0;
            log_msg.field_2._M_local_buf[0] = '\0';
            tinyformat::format<char[8],char_const*>
                      (&local_78,(tinyformat *)"%s: Unable to execute statement: %s\n","ReadKey",
                       local_e8,(char **)args_1);
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            operator=(&log_msg,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            pLVar5 = LogInstance();
            local_78._M_dataplus._M_p = (pointer)0x5a;
            local_78._M_string_length = 0xe20c3b;
            source_file._M_str =
                 "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/sqlite.cpp"
            ;
            source_file._M_len = 0x5a;
            str._M_str = log_msg._M_dataplus._M_p;
            str._M_len = log_msg._M_string_length;
            logging_function._M_str = "ReadKey";
            logging_function._M_len = 7;
            BCLog::Logger::LogPrintStr(pLVar5,str,logging_function,source_file,0x1d4,ALL,Info);
            std::__cxx11::string::~string((string *)&log_msg);
          }
        }
        bVar3 = false;
      }
      sqlite3_clear_bindings(this->m_read_stmt);
      sqlite3_reset(this->m_read_stmt);
      goto LAB_009db271;
    }
  }
  bVar3 = false;
LAB_009db271:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool SQLiteBatch::ReadKey(DataStream&& key, DataStream& value)
{
    if (!m_database.m_db) return false;
    assert(m_read_stmt);

    // Bind: leftmost parameter in statement is index 1
    if (!BindBlobToStatement(m_read_stmt, 1, key, "key")) return false;
    int res = sqlite3_step(m_read_stmt);
    if (res != SQLITE_ROW) {
        if (res != SQLITE_DONE) {
            // SQLITE_DONE means "not found", don't log an error in that case.
            LogPrintf("%s: Unable to execute statement: %s\n", __func__, sqlite3_errstr(res));
        }
        sqlite3_clear_bindings(m_read_stmt);
        sqlite3_reset(m_read_stmt);
        return false;
    }
    // Leftmost column in result is index 0
    value.clear();
    value.write(SpanFromBlob(m_read_stmt, 0));

    sqlite3_clear_bindings(m_read_stmt);
    sqlite3_reset(m_read_stmt);
    return true;
}